

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

void __thiscall PhyloTree::PhyloTree(PhyloTree *this,string *t,bool rooted)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *i;
  PhyloTreeEdge *pPVar2;
  int iVar3;
  size_type sVar4;
  pointer pcVar5;
  pointer pbVar6;
  pointer pPVar7;
  _func_int **pp_Var8;
  undefined8 this_00;
  bool bVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  int *piVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  out_of_range *this_01;
  long *plVar15;
  invalid_argument *this_02;
  pointer pdVar16;
  undefined7 in_register_00000011;
  long lVar17;
  size_t index;
  size_type sVar18;
  char cVar19;
  long lVar20;
  _Map_pointer ppPVar21;
  PhyloTreeEdge *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_01;
  PhyloTreeEdge *this_03;
  pointer pPVar22;
  double dVar24;
  string length;
  string label;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> q;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  hashmap;
  undefined1 local_1c9;
  undefined1 local_1c8 [48];
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  undefined4 local_184;
  _func_int **local_180;
  ulong local_178;
  undefined1 local_170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  _func_int **local_120;
  undefined1 local_118 [32];
  PhyloTreeEdge *local_f8;
  _Map_pointer ppPStack_f0;
  PhyloTreeEdge *local_e8;
  _Elt_pointer pPStack_e0;
  _Elt_pointer local_d8;
  _Map_pointer ppPStack_d0;
  string local_c8;
  string local_a8;
  undefined1 local_88 [24];
  size_type sStack_70;
  float local_68;
  size_t local_60;
  undefined1 auStack_58 [24];
  char local_40 [16];
  PhyloTreeEdge *pPVar23;
  
  local_184 = (undefined4)CONCAT71(in_register_00000011,rooted);
  paVar1 = &(this->newick).field_2;
  (this->newick)._M_dataplus._M_p = (pointer)paVar1;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  local_198 = &this->edges;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar4 = t->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (t->_M_dataplus)._M_p;
    sVar18 = 0;
    lVar17 = 0;
    do {
      lVar17 = lVar17 + (ulong)(pcVar5[sVar18] == '(');
      sVar18 = sVar18 + 1;
    } while (sVar4 != sVar18);
    sVar18 = 0;
    lVar20 = 0;
    do {
      lVar20 = lVar20 + (ulong)(pcVar5[sVar18] == ')');
      sVar18 = sVar18 + 1;
    } while (sVar4 != sVar18);
    __rhs = t;
    if (lVar17 != lVar20) goto LAB_0011f338;
  }
  local_d8 = (_Elt_pointer)0x0;
  ppPStack_d0 = (_Map_pointer)0x0;
  local_e8 = (PhyloTreeEdge *)0x0;
  pPStack_e0 = (_Elt_pointer)0x0;
  local_f8 = (PhyloTreeEdge *)0x0;
  ppPStack_f0 = (_Map_pointer)0x0;
  local_118._16_8_ = (PhyloTreeEdge *)0x0;
  local_118._24_8_ = (_Elt_pointer)0x0;
  local_118._0_8_ = (_Map_pointer)0x0;
  local_118._8_8_ = 0;
  std::_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_initialize_map
            ((_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_118,0);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_180 = (_func_int **)local_170;
  local_178 = 0;
  local_170[0] = 0;
  cVar19 = (char)t;
  std::__cxx11::string::find(cVar19,0x28);
  std::__cxx11::string::substr((ulong)local_88,(ulong)t);
  std::__cxx11::string::operator=((string *)t,(string *)local_88);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_ != __rhs)
  {
    operator_delete((void *)local_88._0_8_);
  }
  std::__cxx11::string::_M_assign((string *)this);
  Tools::despace(t);
  setLeaf2NumMapFromNewick(this,t);
  std::__cxx11::string::find(cVar19,0x28);
  std::__cxx11::string::substr((ulong)local_88,(ulong)t);
  std::__cxx11::string::operator=((string *)t,(string *)local_88);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_ != __rhs)
  {
    operator_delete((void *)local_88._0_8_);
  }
  uVar10 = std::__cxx11::string::rfind(cVar19,0x29);
  if (uVar10 <= t->_M_string_length) {
    t->_M_string_length = uVar10;
    (t->_M_dataplus)._M_p[uVar10] = '\0';
    std::__cxx11::string::_M_assign((string *)t);
    local_88._0_8_ = auStack_58;
    local_88._8_8_ = 1;
    local_88._16_8_ = (_Hash_node_base *)0x0;
    sStack_70 = 0;
    local_68 = 1.0;
    local_60 = 0;
    auStack_58._0_8_ = (pointer)0x0;
    local_190 = paVar1;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1c8,
               (long)(this->leaf2NumMap).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->leaf2NumMap).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_160);
    pdVar16 = (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
    (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
    (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
    local_1c8._0_8_ = (_func_int **)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    if ((pdVar16 != (pointer)0x0) &&
       (operator_delete(pdVar16), (_func_int **)local_1c8._0_8_ != (_func_int **)0x0)) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if (t->_M_string_length != 0) {
      i_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        cVar19 = (t->_M_dataplus)._M_p[(long)&(i_01->_M_dataplus)._M_p];
        if (cVar19 == '(') {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct
                    ((ulong)local_1c8,
                     (char)((long)(this->leaf2NumMap).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->leaf2NumMap).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
          std::deque<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_front<std::__cxx11::string>
                    ((deque<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
          ;
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_);
          }
LAB_0011ed7a:
          i_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(i_01->_M_dataplus)._M_p + 1);
        }
        else if (cVar19 == ')') {
          i = (undefined1 *)((long)&(i_01->_M_dataplus)._M_p + 2);
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Tools::nextIndex(t,(size_t)i,",)");
          pcVar5 = (t->_M_dataplus)._M_p;
          if ((pcVar5 + 1)[(long)&(i_01->_M_dataplus)._M_p] == ':') {
            auStack_58._8_8_ = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(auStack_58 + 8),pcVar5,pcVar5 + t->_M_string_length);
            Tools::substring((string *)local_1c8,(string *)(auStack_58 + 8),(size_t)i,(size_t)__rhs)
            ;
            std::__cxx11::string::operator=((string *)&local_180,(string *)local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_);
            }
            if ((char *)auStack_58._8_8_ != local_40) {
              operator_delete((void *)auStack_58._8_8_);
            }
          }
          else {
            std::__cxx11::string::_M_replace_aux((ulong)&local_180,0,local_178,'\x01');
          }
          this_00 = local_118._16_8_;
          pp_Var8 = local_180;
          piVar12 = __errno_location();
          iVar3 = *piVar12;
          *piVar12 = 0;
          dVar24 = strtod((char *)pp_Var8,(char **)local_1c8);
          if ((_func_int **)local_1c8._0_8_ == pp_Var8) {
            std::__throw_invalid_argument("stod");
LAB_0011f290:
            std::__throw_invalid_argument("stod");
LAB_0011f29c:
            this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
            std::operator+(&local_160,"Could not find label (",&local_140);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_160);
            local_1c8._0_8_ = *plVar15;
            pdVar16 = (pointer)(plVar15 + 2);
            if ((pointer)local_1c8._0_8_ == pdVar16) {
              local_1c8._16_8_ = *pdVar16;
              local_1c8._24_8_ = plVar15[3];
              local_1c8._0_8_ = local_1c8 + 0x10;
            }
            else {
              local_1c8._16_8_ = *pdVar16;
            }
            local_1c8._8_8_ = plVar15[1];
            *plVar15 = (long)pdVar16;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::out_of_range::out_of_range(this_01,(string *)local_1c8);
            __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
          }
          if (*piVar12 == 0) {
            *piVar12 = iVar3;
          }
          else if (*piVar12 == 0x22) {
LAB_0011f314:
            uVar10 = std::__throw_out_of_range("stod");
            goto LAB_0011f320;
          }
          PhyloTreeEdge::setAttribute((PhyloTreeEdge *)this_00,dVar24);
          if ((char)local_184 == '\0') {
            if ((*(((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (local_118._16_8_ + 8))->m_bits).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start & 1) != 0) {
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::flip
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         (local_118._16_8_ + 8));
            }
            iVar13 = std::
                     _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_88,(key_type *)(local_118._16_8_ + 8));
            if (iVar13.
                super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              pPVar22 = (this->edges).
                        super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar7 = (this->edges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pmVar14 = std::__detail::
                        _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_88,(key_type *)(local_118._16_8_ + 8));
              *pmVar14 = ((long)pPVar7 - (long)pPVar22 >> 3) * -0x71c71c71c71c71c7;
              goto LAB_0011f0f6;
            }
            pmVar14 = std::__detail::
                      _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_88,(key_type *)(local_118._16_8_ + 8));
            pPVar23 = (local_198->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                      ._M_impl.super__Vector_impl_data._M_start + *pmVar14;
            local_120 = ((Bipartition *)(local_118._16_8_ + 0x28))->_vptr_Bipartition;
            dVar24 = PhyloTreeEdge::getLength(pPVar23);
            PhyloTreeEdge::setAttribute(pPVar23,(double)local_120 + dVar24);
          }
          else {
LAB_0011f0f6:
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                      (local_198,(value_type *)local_118._16_8_);
          }
          std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::pop_front
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_118);
          i_01 = __rhs;
        }
        else {
          if (cVar19 == ',') goto LAB_0011ed7a;
          i_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Tools::nextIndex(t,(size_t)i_01,":");
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Tools::nextIndex(t,(size_t)i_01," ,()");
          if (__rhs < i_00) {
            std::__cxx11::string::_M_replace_aux((ulong)&local_180,0,local_178,'\x01');
            i_00 = __rhs;
          }
          else {
            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    Tools::nextIndex(t,(size_t)i_00," ,)");
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            pcVar5 = (t->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,pcVar5,pcVar5 + t->_M_string_length);
            Tools::substring((string *)local_1c8,&local_a8,
                             (size_t)((long)&(i_00->_M_dataplus)._M_p + 1),(size_t)__rhs);
            std::__cxx11::string::operator=((string *)&local_180,(string *)local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar5 = (t->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar5,pcVar5 + t->_M_string_length);
          Tools::substring((string *)local_1c8,&local_c8,(size_t)i_01,(size_t)i_00);
          std::__cxx11::string::operator=((string *)&local_140,(string *)local_1c8);
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          _Var11 = std::
                   __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                             ((this->leaf2NumMap).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->leaf2NumMap).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_140);
          pp_Var8 = local_180;
          pbVar6 = (this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          index = (size_t)(int)((ulong)((long)_Var11._M_current - (long)pbVar6) >> 5);
          if (index == (long)(this->leaf2NumMap).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)
          goto LAB_0011f29c;
          piVar12 = __errno_location();
          iVar3 = *piVar12;
          *piVar12 = 0;
          dVar24 = strtod((char *)pp_Var8,(char **)local_1c8);
          pPVar23 = local_e8;
          if ((_func_int **)local_1c8._0_8_ == pp_Var8) goto LAB_0011f290;
          if (*piVar12 == 0) {
            *piVar12 = iVar3;
          }
          else if (*piVar12 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_0011f314;
          }
          (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[index] = dVar24;
          this_03 = (PhyloTreeEdge *)local_118._16_8_;
          pPVar2 = local_f8;
          ppPVar21 = ppPStack_f0;
          while (i_01 = __rhs, this_03 != pPVar23) {
            Bipartition::addOne(&this_03->super_Bipartition,index);
            this_03 = this_03 + 1;
            if (this_03 == pPVar2) {
              this_03 = ppPVar21[1];
              ppPVar21 = ppPVar21 + 1;
              pPVar2 = this_03 + 7;
            }
          }
        }
      } while (i_01 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      t->_M_string_length);
    }
    pPVar22 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar22) {
      lVar17 = 0;
      uVar10 = 0;
      do {
        pPVar23 = (PhyloTreeEdge *)((long)&(pPVar22->super_Bipartition)._vptr_Bipartition + lVar17);
        PhyloTreeEdge::asSplit((Bipartition *)local_1c8,pPVar23);
        local_160._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Bipartition,std::allocator<Bipartition>,Bipartition>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length,
                   (Bipartition **)&local_160,(allocator<Bipartition> *)&local_1c9,
                   (Bipartition *)local_1c8);
        PhyloTreeEdge::setOriginalEdge(pPVar23,(shared_ptr<Bipartition> *)&local_160);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length);
        }
        local_1c8._0_8_ = &PTR_toString_abi_cxx11__0013ea08;
        bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (local_1c8 + 8));
        if (!bVar9) {
          __assert_fail("m_check_invariants()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x279,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if ((pointer)local_1c8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._8_8_);
        }
        PhyloTreeEdge::setOriginalID
                  ((PhyloTreeEdge *)
                   ((long)&(((local_198->
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                             _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                           _vptr_Bipartition + lVar17),(int)uVar10);
        uVar10 = uVar10 + 1;
        pPVar22 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x48;
      } while (uVar10 < (ulong)(((long)(this->edges).
                                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar22 >>
                                3) * -0x71c71c71c71c71c7));
    }
    std::
    _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_88);
    if (local_180 != (_func_int **)local_170) {
      operator_delete(local_180);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque
              ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_118);
    return;
  }
LAB_0011f320:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar10);
LAB_0011f338:
  this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 "Bracket mismatch error in tree: ",__rhs);
  std::invalid_argument::invalid_argument(this_02,(string *)local_118);
  __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

PhyloTree::PhyloTree(string t, bool rooted) {
    // do bracket counting sanity check
    if (count(t.begin(), t.end(), '(') != count(t.begin(), t.end(), ')')) {
        throw invalid_argument("Bracket mismatch error in tree: " + t);
    }

    int leafNum = 0;
    deque<PhyloTreeEdge> q;
    string label, length;
    size_t i = 0;

    // remove anything before the first (
    t = t.substr(t.find_first_of('('));
    newick = t;

    // remove whitespace
    Tools::despace(t);
    setLeaf2NumMapFromNewick(t);
    //pull off ';' if at end
//    t = t.erase(t.find_last_of(";"));

    // pull off the first and last brackets (and a root length, between the last bracket and ;, if there is one.
    t = t.substr(t.find_first_of('(') + 1);
    t = t.erase(t.find_last_of(')'));

    std::unordered_map<bitset_t, size_t, BitsetHash> hashmap; // Maintain store of edges keyed by bitset, value is index of edges[index]
    try {
        size_t end_of_label, end_of_length, alt_end_of_label;
        leafEdgeLengths = vector<double>(leaf2NumMap.size());
        size_t lastLeaf = leaf2NumMap.size();
        while (i < t.size()) {
            switch (t.at(i)) {
                case '(': {
                    q.emplace_front(string(leaf2NumMap.size(), '0'));
                    i++;
                    break;
                }

                case ')': {
                    end_of_length = Tools::nextIndex(t, i + 2, ",)");
                    if (t[i + 1] == ':') {
                        length = Tools::substring(t, i + 2, end_of_length);
                    }
                    else {
                        length = LENGTH_DEFAULT;
                    }
                    q.front().setAttribute(stod(length));

                    if (!rooted) {
                        if (q.front().partition[0]) {
                            q.front().partition.flip();
                        }
                        if (hashmap.find(q.front().partition) == hashmap.end()) {  // never before seen edge
                            hashmap[q.front().partition] = edges.size();
                            edges.push_back(q.front());
                        }
                        else {
                            size_t index = hashmap[q.front().partition];
                            edges[index].setAttribute(q.front().length + edges[index].getLength());
                        }
                    }
                    else {
                        edges.push_back(q.front());
                    }
                    q.pop_front();
                    i = end_of_length;
                    break;
                }

                case ',': {
                    i++;
                    break;
                }

                    // this char is the beginning of a leaf name
                default: {
                    end_of_label = Tools::nextIndex(t, i, ":");

                    // check if 'correct' :-delimited length is missing
                    alt_end_of_label = Tools::nextIndex(t, i, " ,()");
                    if (alt_end_of_label < end_of_label) {
                        end_of_label = end_of_length = alt_end_of_label;
                        length = LENGTH_DEFAULT;
                    }
                    else {
                        end_of_length = Tools::nextIndex(t, end_of_label, " ,)");
                        length = Tools::substring(t, end_of_label + 1, end_of_length);
                    }
                    label = Tools::substring(t, i, end_of_label);
                    leafNum = lower_bound(leaf2NumMap.begin(), leaf2NumMap.end(), label) - leaf2NumMap.begin();
                    if (leafNum == leaf2NumMap.size()) throw out_of_range("Could not find label (" + label + ") in leaf2NumMap");
                    leafEdgeLengths[leafNum] = stod(length);

                    for (auto &e: q) {
                        e.addOne((size_t) leafNum);
                    }
                    i = end_of_length;
                }
            }
        }
    }
    catch (out_of_range &range_err) {
        throw range_err;
    }

//    if (!rooted) {
//        size_t lastLeaf = leaf2NumMap.size() - 1;
//        for (auto &e : edges) {
//            if (e.contains(lastLeaf)) {
//                e.complement(lastLeaf + 1);
//            }
//        }
//    }

    for (size_t k = 0; k < edges.size(); ++k) {
        edges[k].setOriginalEdge(make_shared<Bipartition>(edges[k].asSplit()));
        edges[k].setOriginalID((int) k);
    }
}